

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O3

void __thiscall udpdiscovery::impl::PeerEnv::deleteIdle(PeerEnv *this,long cur_time_ms)

{
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *this_00;
  ulong uVar1;
  vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  to_delete;
  vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  local_58;
  value_type local_38;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  local_58.
  super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (_List_iterator<udpdiscovery::DiscoveredPeer> *)0x0;
  local_58.
  super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (_List_iterator<udpdiscovery::DiscoveredPeer> *)0x0;
  local_58.
  super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (_List_iterator<udpdiscovery::DiscoveredPeer> *)0x0;
  this_00 = &this->discovered_peers_;
  local_38._M_node =
       (this->discovered_peers_).
       super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (local_38._M_node != (_List_node_base *)this_00) {
    do {
      if ((this->parameters_).discovered_peer_ttl_ms_ <
          cur_time_ms - (long)local_38._M_node[4]._M_next) {
        if (local_58.
            super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_58.
            super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
          ::_M_realloc_insert(&local_58,
                              (iterator)
                              local_58.
                              super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&local_38);
        }
        else {
          (local_58.
           super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_node = local_38._M_node;
          local_58.
          super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      local_38._M_node = (local_38._M_node)->_M_next;
    } while (local_38._M_node != (_List_node_base *)this_00);
    if (local_58.
        super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_58.
        super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar1 = 0;
      do {
        std::__cxx11::
        list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::_M_erase
                  (this_00,local_58.
                           super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_node);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)((long)local_58.
                                     super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_58.
                                     super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  if (local_58.
      super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_List_iterator<udpdiscovery::DiscoveredPeer> *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void deleteIdle(long cur_time_ms) {
    lock_.Lock();

    std::vector<std::list<DiscoveredPeer>::iterator> to_delete;
    for (std::list<DiscoveredPeer>::iterator it = discovered_peers_.begin();
         it != discovered_peers_.end(); ++it) {
      if (cur_time_ms - (*it).last_updated() >
          parameters_.discovered_peer_ttl_ms())
        to_delete.push_back(it);
    }

    for (size_t i = 0; i < to_delete.size(); ++i)
      discovered_peers_.erase(to_delete[i]);

    lock_.Unlock();
  }